

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O3

void __thiscall chatra::Lock::releaseIfExists(Lock *this,Reference ref)

{
  long lVar1;
  ReferenceNode *local_28;
  Reference ref_local;
  
  lVar1 = 0;
  local_28 = ref.node;
  do {
    std::
    _Hashtable<chatra::Reference,_chatra::Reference,_std::allocator<chatra::Reference>,_std::__detail::_Identity,_std::equal_to<chatra::Reference>,_std::hash<chatra::Reference>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<chatra::Reference,_chatra::Reference,_std::allocator<chatra::Reference>,_std::__detail::_Identity,_std::equal_to<chatra::Reference>,_std::hash<chatra::Reference>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)((long)&this->refs[0]._M_h._M_buckets + lVar1),&local_28);
    lVar1 = lVar1 + 0x38;
  } while (lVar1 != 0xa8);
  return;
}

Assistant:

void Lock::releaseIfExists(Reference ref) {
	chatra_assert(!methodCall);
	CHATRA_DEBUG_LOCK_AUDIT;
	CHATRA_DEBUG_LOCK_LOG0("releaseIfExists");

#ifdef CHATRA_DEBUG_LOCK
	auto requester = ref.lockedBy();
	if (requester == InvalidRequester) {
		for (auto& e : refs)
			chatra_assert(e.count(ref) == 0);
		return;
	}
	chatra_assert(ref.lockedBy() == thread->getId());
	if (methodCall && refs[static_cast<size_t>(LockType::Temporary)].count(ref) != 0)
		return;
	size_t count = 0;
	for (auto& e : refs)
		count += e.erase(ref);
	chatra_assert(count <= 1);
	if (count != 0)
		ref.unlock();
#else
	for (auto& e : refs)
		e.erase(ref);
	// Omitted ref.unlock() for performance reason
#endif
}